

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  undefined8 uVar2;
  nn_fsm *pnVar3;
  nn_fsm *pnVar4;
  nn_fsm *subj;
  int iVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  nn_queue_item *pnVar10;
  uint *hashed_len;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  undefined4 uVar11;
  nn_fsm_fn p_Var12;
  nn_fsm **ppnVar13;
  nn_usock *self_00;
  nn_fsm_event *pnVar14;
  nn_queue_item nVar15;
  nn_fsm_fn p_Var16;
  long lVar17;
  nn_fsm_event *unaff_R13;
  nn_fsm_event *pnVar18;
  ulong uVar19;
  char *pos;
  nn_iovec open_request;
  uint8_t rand_key [16];
  nn_fsm_event local_e8;
  nn_fsm_event *local_c0;
  nn_fsm *local_b8;
  nn_fsm_event *local_b0;
  nn_fsm *local_a8;
  nn_fsm_event *local_a0;
  nn_fsm_event *local_98;
  nn_fsm_event *local_90;
  nn_fsm *local_88;
  nn_fsm_event *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm_event *local_60;
  nn_iovec local_58;
  size_t local_48 [3];
  
  pnVar18 = &local_e8;
  hashed_len = &switchD_0013974a::switchdataD_00141d00;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_0013a6cd;
    if (type != -2) goto LAB_0013a6d5;
    if (self[0x33].fn != (nn_fsm_fn)0x0) {
      nn_ws_handshake_handler_cold_35();
LAB_0013a438:
      nn_ws_handshake_handler_cold_43();
LAB_0013a43d:
      nn_ws_handshake_handler_cold_41();
LAB_0013a442:
      nn_ws_handshake_handler_cold_36();
LAB_0013a447:
      nn_ws_handshake_handler_cold_40();
LAB_0013a44c:
      nn_ws_handshake_handler_cold_37();
LAB_0013a451:
      nn_ws_handshake_handler_cold_38();
LAB_0013a456:
      nn_ws_handshake_handler_cold_15();
LAB_0013a45b:
      nn_ws_handshake_handler_cold_30();
LAB_0013a460:
      nn_ws_handshake_handler_cold_14();
LAB_0013a465:
      nn_ws_handshake_handler_cold_29();
LAB_0013a46a:
      nn_ws_handshake_handler_cold_11();
LAB_0013a46f:
      nn_ws_handshake_handler_cold_13();
LAB_0013a474:
      nn_ws_handshake_handler_cold_12();
LAB_0013a479:
      nn_ws_handshake_handler_cold_26();
LAB_0013a47e:
      nn_ws_handshake_handler_cold_28();
      pnVar18 = unaff_R13;
LAB_0013a483:
      nn_ws_handshake_handler_cold_27();
LAB_0013a488:
      iVar5 = (int)hashed_len;
      if (*(char *)&(local_e8.fsm)->fn == '\0') {
LAB_0013a495:
        if ((((local_98->fsm != (nn_fsm *)0x0) && (pnVar3 = local_b0->fsm, pnVar3 != (nn_fsm *)0x0))
            && (pnVar4 = local_c0->fsm, pnVar4 != (nn_fsm *)0x0)) &&
           (((subj = local_90->fsm, subj != (nn_fsm *)0x0 &&
             (iVar6 = nn_ws_validate_value("101",(char *)local_98->fsm,(size_t)local_78->fn,iVar5),
             iVar6 != 0)) &&
            ((iVar6 = nn_ws_validate_value("websocket",(char *)pnVar3,(size_t)local_b8->fn,iVar5),
             iVar6 != 0 &&
             ((iVar6 = nn_ws_validate_value
                                 ("Upgrade",(char *)pnVar4,(size_t)(local_e8.item.next)->next,iVar5)
              , iVar6 != 0 &&
              (iVar5 = nn_ws_validate_value
                                 ((char *)&self[0x34].stopped.type,(char *)subj,
                                  (size_t)self[0x34].stopped.srcptr,iVar5), iVar5 != 0)))))))) {
LAB_0013a1ad:
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 8;
          return;
        }
LAB_0013a27b:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      nn_ws_handshake_handler_cold_10();
LAB_0013a55b:
      if (*(char *)&(local_e8.fsm)->fn != '\0') {
        nn_ws_handshake_handler_cold_25();
      }
LAB_0013a569:
      uVar11 = 3;
      if (((*(long *)pnVar18 != 0) && (pnVar3 = local_b0->fsm, pnVar3 != (nn_fsm *)0x0)) &&
         ((pnVar10 = self[0x33].stopped.item.next, pnVar10 != (nn_queue_item *)0x0 &&
          ((local_98->fsm != (nn_fsm *)0x0 && (local_c0->fsm != (nn_fsm *)0x0)))))) {
        iVar5 = nn_ws_validate_value
                          ("13",(char *)local_c0->fsm,(size_t)(local_e8.item.next)->next,
                           (int)hashed_len);
        if (iVar5 == 0) {
          uVar11 = 4;
        }
        else {
          iVar5 = nn_ws_validate_value
                            ("websocket",(char *)pnVar3,(size_t)local_b8->fn,(int)hashed_len);
          if ((iVar5 != 0) &&
             (iVar5 = nn_ws_validate_value
                                ("Upgrade",(char *)pnVar10,(size_t)self[0x34].fn,(int)hashed_len),
             iVar5 != 0)) {
            pnVar3 = local_a0->fsm;
            if (pnVar3 == (nn_fsm *)0x0) {
              iVar5 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
              uVar11 = 6;
              if (iVar5 != 0) {
                uVar11 = 0;
              }
              *(undefined4 *)&self[0x35].stopped.item.next = uVar11;
              goto LAB_0013a65b;
            }
            pnVar4 = (nn_fsm *)local_a8->fn;
            lVar17 = 8;
            uVar11 = 7;
            do {
              iVar5 = nn_ws_validate_value
                                (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar17),
                                 (char *)pnVar3,(size_t)pnVar4,(int)hashed_len);
              if (iVar5 != 0) {
                uVar11 = 6;
                if (*(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) ==
                    *(int *)(&UNK_00158c88 + lVar17)) {
                  uVar11 = 0;
                }
                *(undefined4 *)&self[0x35].stopped.item.next = uVar11;
                goto LAB_0013a65b;
              }
              lVar17 = lVar17 + 0x10;
            } while (lVar17 != 0xa8);
          }
        }
      }
      *(undefined4 *)&self[0x35].stopped.item.next = uVar11;
LAB_0013a65b:
      *(undefined4 *)&self[1].fn = 3;
      nn_ws_handshake_server_reply((nn_ws_handshake *)self);
      return;
    }
    if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) goto LAB_0013a438;
    nn_timer_start((nn_timer *)&self[1].shutdown_fn,*(int *)&self[3].stopped.srcptr);
    iVar5 = *(int *)((long)&self[1].fn + 4);
    if (iVar5 == 2) {
      p_Var16 = self[0x33].shutdown_fn;
      if (p_Var16 < (nn_fsm_fn)0x1001) {
        *(undefined4 *)&self[1].fn = 2;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        ppnVar13 = &self[4].owner;
        goto LAB_0013a2c9;
      }
      goto LAB_0013a442;
    }
    if (iVar5 == 1) {
      if ((nn_fsm_fn)0x200 < self[0x33].shutdown_fn) goto LAB_0013a43d;
      *(undefined4 *)&self[1].fn = 4;
      nn_random_generate(local_48,0x10);
      hashed_len = (uint *)0x19;
      iVar5 = nn_base64_encode((uint8_t *)local_48,0x10,(char *)&local_e8,0x19);
      if (iVar5 < 0) goto LAB_0013a447;
      sVar8 = strlen((char *)&local_e8);
      if (sVar8 != 0x18) goto LAB_0013a44c;
      iVar5 = nn_ws_handshake_hash_key
                        ((char *)&local_e8,0x18,(char *)&self[0x34].stopped.type,(size_t)hashed_len)
      ;
      if (iVar5 == 0x1c) {
        uVar1 = *(uint *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4);
        hashed_len = (uint *)(ulong)uVar1;
        lVar17 = 8;
        src = 0x158c90;
        do {
          if (*(uint *)(&UNK_00158c8c + lVar17) == uVar1) {
            ppnVar13 = &self[4].owner;
            uVar2._0_4_ = self[4].state;
            uVar2._4_4_ = self[4].src;
            sprintf((char *)ppnVar13,
                    "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                    ,uVar2,self[4].srcptr,&local_e8,
                    *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar17));
            local_58.iov_len = strlen((char *)ppnVar13);
            local_58.iov_base = ppnVar13;
            nn_usock_send(*(nn_usock **)&self[3].stopped.type,&local_58,1);
            return;
          }
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0xa8);
        nn_ws_handshake_handler_cold_39();
        type = extraout_EDX;
        goto switchD_0013974a_caseD_5;
      }
      goto LAB_0013a451;
    }
    goto LAB_0013a735;
  case 2:
    if (src == 2) goto LAB_0013a263;
    if (src != 1) goto LAB_0013a6ff;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_0013a27b;
    if (type == 4) {
      ppnVar13 = &self[4].owner;
      pvVar7 = memchr(ppnVar13,0,0x1000);
      if (pvVar7 == (void *)0x0) goto LAB_0013a45b;
      sVar8 = strlen((char *)ppnVar13);
      if (0xfff < sVar8) goto LAB_0013a465;
      local_e8.fsm = (nn_fsm *)ppnVar13;
      pcVar9 = strstr((char *)ppnVar13,"\r\n\r\n");
      if (pcVar9 == (char *)0x0) {
        p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
        self[0x33].fn = p_Var12;
        if ((nn_fsm_fn)0xfff < p_Var12) goto LAB_0013a47e;
        pnVar18 = unaff_R13;
        if ((nn_fsm_fn)0x3 < p_Var12) {
          ppnVar13 = (nn_fsm **)(p_Var12 + (long)ppnVar13);
          p_Var16 = p_Var12 + (long)((long)&self[4].srcptr + 4);
          uVar19 = 4;
          unaff_R13 = (nn_fsm_event *)0x142084;
          do {
            iVar5 = bcmp("\r\n\r\n",p_Var16,uVar19);
            if (iVar5 == 0) {
              if (uVar19 < 4) goto LAB_0013a3d9;
              goto LAB_0013a479;
            }
            p_Var16 = p_Var16 + 1;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
          uVar19 = 0;
LAB_0013a3d9:
          p_Var16 = (nn_fsm_fn)(4 - uVar19);
          self[0x33].shutdown_fn = p_Var16;
          if ((nn_fsm_fn)0x1000 < p_Var12 + (long)p_Var16) {
            *(undefined4 *)&self[0x35].stopped.item.next = 1;
            *(undefined4 *)&self[1].fn = 3;
            nn_ws_handshake_server_reply((nn_ws_handshake *)self);
            return;
          }
          goto LAB_0013a41e;
        }
        goto LAB_0013a483;
      }
      self[0x34].srcptr = (void *)0x0;
      self[0x34].owner = (nn_fsm *)0x0;
      self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
      self[0x34].state = 0;
      self[0x34].src = 0;
      self[0x33].stopped.item.next = (nn_queue_item *)0x0;
      self[0x34].fn = (nn_fsm_fn)0x0;
      self[0x33].stopped.srcptr = (void *)0x0;
      *(undefined8 *)&self[0x33].stopped.type = 0;
      self[0x33].stopped.fsm = (nn_fsm *)0x0;
      *(undefined8 *)&self[0x33].stopped.src = 0;
      self[0x33].owner = (nn_fsm *)0x0;
      self[0x33].ctx = (nn_ctx *)0x0;
      self[0x33].state = 0;
      self[0x33].src = 0;
      self[0x33].srcptr = (void *)0x0;
      self[0x35].stopped.fsm = (nn_fsm *)0x0;
      *(undefined8 *)&self[0x35].stopped.src = 0;
      *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
      iVar5 = nn_ws_match_token("GET ",(char **)&local_e8,0,(int)hashed_len);
      if (iVar5 == 0) goto LAB_0013a65b;
      hashed_len = (uint *)0x0;
      iVar5 = nn_ws_match_value(" ",(char **)&local_e8,0,0,(char **)&self[0x35].stopped,
                                (size_t *)&self[0x35].stopped.src);
      if (((iVar5 == 0) ||
          (iVar5 = nn_ws_match_token("HTTP/1.1",(char **)&local_e8,0,(int)hashed_len), iVar5 == 0))
         || (iVar5 = nn_ws_match_token("\r\n",(char **)&local_e8,0,(int)hashed_len), iVar5 == 0))
      goto LAB_0013a65b;
      pnVar18 = (nn_fsm_event *)&self[0x33].state;
      local_98 = &self[0x33].stopped;
      local_b0 = (nn_fsm_event *)&self[0x33].stopped.srcptr;
      local_c0 = (nn_fsm_event *)&self[0x34].shutdown_fn;
      local_a0 = (nn_fsm_event *)&self[0x34].srcptr;
      local_b8 = (nn_fsm *)&self[0x33].stopped.type;
      local_e8.item.next = (nn_queue_item *)&self[0x34].state;
      local_a8 = (nn_fsm *)&self[0x34].owner;
      if (*(char *)&(local_e8.fsm)->fn != '\0') {
        local_90 = (nn_fsm_event *)&self[0x33].owner;
        local_70 = (nn_fsm *)&self[0x33].ctx;
        local_78 = (nn_fsm *)&self[0x33].stopped.src;
        local_80 = (nn_fsm_event *)&self[0x35].stopped.srcptr;
        local_88 = (nn_fsm *)&self[0x35].stopped.type;
LAB_00139f1f:
        local_58.iov_base = (char *)0x0;
        local_48[0] = 0;
        iVar5 = nn_ws_match_token("Host:",(char **)&local_e8,1,(int)hashed_len);
        pnVar14 = pnVar18;
        nVar15.next = (nn_queue_item *)&self[0x33].srcptr;
        if (((iVar5 == 0) &&
            (iVar5 = nn_ws_match_token("Origin:",(char **)&local_e8,1,(int)hashed_len),
            pnVar14 = local_90, nVar15.next = (nn_queue_item *)local_70, iVar5 == 0)) &&
           ((iVar5 = nn_ws_match_token("Sec-WebSocket-Key:",(char **)&local_e8,1,(int)hashed_len),
            pnVar14 = local_98, nVar15.next = (nn_queue_item *)local_78, iVar5 == 0 &&
            (iVar5 = nn_ws_match_token("Upgrade:",(char **)&local_e8,1,(int)hashed_len),
            pnVar14 = local_b0, nVar15.next = (nn_queue_item *)local_b8, iVar5 == 0)))) {
          iVar5 = nn_ws_match_token("Connection:",(char **)&local_e8,1,(int)hashed_len);
          if (iVar5 != 0) {
            hashed_len = (uint *)0x1;
            iVar5 = nn_ws_match_value("\r\n",(char **)&local_e8,1,1,(char **)&local_58,local_48);
            pnVar10 = (nn_queue_item *)nn_strcasestr((char *)local_58.iov_base,"upgrade");
            self[0x33].stopped.item.next = pnVar10;
            if (pnVar10 != (nn_queue_item *)0x0) {
              self[0x34].fn = (nn_fsm_fn)0x7;
            }
            goto LAB_0013a014;
          }
          iVar5 = nn_ws_match_token("Sec-WebSocket-Version:",(char **)&local_e8,1,(int)hashed_len);
          pnVar14 = local_c0;
          nVar15.next = local_e8.item.next;
          if (((iVar5 == 0) &&
              (iVar5 = nn_ws_match_token("Sec-WebSocket-Protocol:",(char **)&local_e8,1,
                                         (int)hashed_len), pnVar14 = local_a0,
              nVar15.next = (nn_queue_item *)local_a8, iVar5 == 0)) &&
             (iVar5 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)&local_e8,1,
                                        (int)hashed_len), pnVar14 = local_80,
             nVar15.next = (nn_queue_item *)local_88, iVar5 == 0)) {
            iVar5 = nn_ws_match_token("\r\n",(char **)&local_e8,1,(int)hashed_len);
            if (iVar5 == 0) {
              pnVar14 = (nn_fsm_event *)0x0;
              nVar15.next = (nn_queue_item *)(nn_fsm *)0x0;
              goto LAB_0013a00c;
            }
            goto LAB_0013a55b;
          }
        }
LAB_0013a00c:
        hashed_len = (uint *)0x1;
        iVar5 = nn_ws_match_value("\r\n",(char **)&local_e8,1,1,(char **)pnVar14,
                                  (size_t *)nVar15.next);
LAB_0013a014:
        if (iVar5 == 0) goto LAB_0013a65b;
        if (*(char *)&(local_e8.fsm)->fn == '\0') goto LAB_0013a569;
        goto LAB_00139f1f;
      }
      goto LAB_0013a569;
    }
    break;
  case 3:
    if (src == 2) goto LAB_0013a245;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0013a27b;
      if (type == 3) goto LAB_0013a1ad;
      src = type;
      nn_ws_handshake_handler_cold_22();
      type = extraout_EDX_00;
      goto switchD_0013974a_caseD_4;
    }
    goto LAB_0013a6e7;
  case 4:
switchD_0013974a_caseD_4:
    if (src == 2) goto LAB_0013a254;
    if (src != 1) goto LAB_0013a6ef;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_0013a27b;
    if (type == 3) {
      *(undefined4 *)&self[1].fn = 5;
      self_00 = *(nn_usock **)&self[3].stopped.type;
      p_Var16 = self[0x33].shutdown_fn;
      ppnVar13 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
LAB_0013a2c9:
      nn_usock_recv(self_00,ppnVar13,(size_t)p_Var16,(int *)0x0);
      return;
    }
    goto LAB_0013a744;
  case 5:
switchD_0013974a_caseD_5:
    if (src == 2) {
      if (type == 1) goto LAB_0013a27b;
      nn_ws_handshake_handler_cold_9();
      type = extraout_EDX_01;
LAB_0013a245:
      if (type == 1) goto LAB_0013a27b;
      nn_ws_handshake_handler_cold_21();
      type = extraout_EDX_02;
LAB_0013a254:
      if (type == 1) goto LAB_0013a27b;
      nn_ws_handshake_handler_cold_18();
      type = extraout_EDX_03;
LAB_0013a263:
      if (type == 1) goto LAB_0013a27b;
      nn_ws_handshake_handler_cold_24();
      type = extraout_EDX_04;
LAB_0013a272:
      if (type == 1) goto LAB_0013a27b;
      goto LAB_0013a72b;
    }
    if (src != 1) goto LAB_0013a6df;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_0013a27b;
    if (type == 4) {
      pnVar3 = (nn_fsm *)((long)&self[0x35].stopped.item.next + 4);
      pvVar7 = memchr(pnVar3,0,0x200);
      if (pvVar7 == (void *)0x0) goto LAB_0013a456;
      sVar8 = strlen((char *)pnVar3);
      if (0x1ff < sVar8) goto LAB_0013a460;
      local_e8.fsm = pnVar3;
      pcVar9 = strstr((char *)pnVar3,"\r\n\r\n");
      if (pcVar9 != (char *)0x0) {
        *(undefined8 *)&self[0x34].stopped.src = 0;
        self[0x34].stopped.srcptr = (void *)0x0;
        self[0x34].ctx = (nn_ctx *)0x0;
        self[0x34].stopped.fsm = (nn_fsm *)0x0;
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x35].state = 0;
        self[0x35].src = 0;
        self[0x35].srcptr = (void *)0x0;
        self[0x35].owner = (nn_fsm *)0x0;
        self[0x35].ctx = (nn_ctx *)0x0;
        iVar5 = nn_ws_match_token("HTTP/1.1 ",(char **)&local_e8,0,(int)hashed_len);
        if (iVar5 != 0) {
          local_98 = (nn_fsm_event *)&self[0x35].state;
          local_78 = (nn_fsm *)&self[0x35].srcptr;
          hashed_len = (uint *)0x0;
          iVar5 = nn_ws_match_value(" ",(char **)&local_e8,0,0,(char **)local_98,(size_t *)local_78)
          ;
          if (iVar5 != 0) {
            hashed_len = (uint *)0x0;
            iVar5 = nn_ws_match_value("\r\n",(char **)&local_e8,0,0,(char **)&self[0x35].owner,
                                      (size_t *)&self[0x35].ctx);
            if (iVar5 != 0) {
              local_90 = (nn_fsm_event *)&self[0x34].stopped.src;
              local_b0 = (nn_fsm_event *)&self[0x33].stopped.srcptr;
              local_c0 = (nn_fsm_event *)&self[0x33].stopped.item;
              local_a0 = (nn_fsm_event *)&self[0x34].shutdown_fn;
              local_80 = (nn_fsm_event *)&self[0x34].srcptr;
              local_70 = (nn_fsm *)&self[0x34].stopped.srcptr;
              local_b8 = (nn_fsm *)&self[0x33].stopped.type;
              local_e8.item.next = (nn_queue_item *)(self + 0x34);
              local_a8 = (nn_fsm *)&self[0x34].state;
              local_88 = (nn_fsm *)&self[0x34].owner;
              local_60 = (nn_fsm_event *)&self[0x35].stopped.srcptr;
              local_68 = (nn_fsm *)&self[0x35].stopped.type;
              do {
                iVar5 = (int)hashed_len;
                if (*(char *)&(local_e8.fsm)->fn == '\0') goto LAB_0013a495;
                iVar5 = nn_ws_match_token("Server:",(char **)&local_e8,1,iVar5);
                pnVar14 = (nn_fsm_event *)&self[0x34].ctx;
                nVar15.next = (nn_queue_item *)&self[0x34].stopped;
                if (((((iVar5 == 0) &&
                      (iVar5 = nn_ws_match_token("Sec-WebSocket-Accept:",(char **)&local_e8,1,
                                                 (int)hashed_len), pnVar14 = local_90,
                      nVar15.next = (nn_queue_item *)local_70, iVar5 == 0)) &&
                     (iVar5 = nn_ws_match_token("Upgrade:",(char **)&local_e8,1,(int)hashed_len),
                     pnVar14 = local_b0, nVar15.next = (nn_queue_item *)local_b8, iVar5 == 0)) &&
                    ((iVar5 = nn_ws_match_token("Connection:",(char **)&local_e8,1,(int)hashed_len),
                     pnVar14 = local_c0, nVar15.next = local_e8.item.next, iVar5 == 0 &&
                     (iVar5 = nn_ws_match_token("Sec-WebSocket-Version-Server:",(char **)&local_e8,1
                                                ,(int)hashed_len), pnVar14 = local_a0,
                     nVar15.next = (nn_queue_item *)local_a8, iVar5 == 0)))) &&
                   ((iVar5 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",(char **)&local_e8,1
                                               ,(int)hashed_len), pnVar14 = local_80,
                    nVar15.next = (nn_queue_item *)local_88, iVar5 == 0 &&
                    (iVar5 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)&local_e8,1,
                                               (int)hashed_len), pnVar14 = local_60,
                    nVar15.next = (nn_queue_item *)local_68, iVar5 == 0)))) {
                  iVar5 = nn_ws_match_token("\r\n",(char **)&local_e8,1,(int)hashed_len);
                  if (iVar5 != 0) goto LAB_0013a488;
                  pnVar14 = (nn_fsm_event *)0x0;
                  nVar15.next = (nn_queue_item *)(nn_fsm *)0x0;
                }
                hashed_len = (uint *)0x1;
                iVar5 = nn_ws_match_value("\r\n",(char **)&local_e8,1,1,(char **)pnVar14,
                                          (size_t *)nVar15.next);
                unaff_R13 = &local_e8;
              } while (iVar5 != 0);
            }
          }
        }
      }
      p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var12;
      if ((nn_fsm_fn)0x1ff < p_Var12) goto LAB_0013a46f;
      if ((nn_fsm_fn)0x3 < p_Var12) {
        ppnVar13 = (nn_fsm **)(p_Var12 + (long)&pnVar3->fn);
        p_Var16 = p_Var12 + (long)&self[0x35].stopped.item;
        uVar19 = 4;
        unaff_R13 = (nn_fsm_event *)0x142084;
        do {
          iVar5 = bcmp("\r\n\r\n",p_Var16,uVar19);
          if (iVar5 == 0) {
            if (uVar19 < 4) goto LAB_0013a345;
            goto LAB_0013a46a;
          }
          p_Var16 = p_Var16 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        uVar19 = 0;
LAB_0013a345:
        p_Var16 = (nn_fsm_fn)(4 - uVar19);
        self[0x33].shutdown_fn = p_Var16;
        if ((nn_fsm_fn)0x200 < p_Var12 + (long)p_Var16) goto LAB_0013a27b;
LAB_0013a41e:
        pnVar10 = &self[0x32].stopped.item;
        *(int *)&pnVar10->next = *(int *)&pnVar10->next + 1;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        goto LAB_0013a2c9;
      }
      goto LAB_0013a474;
    }
    goto LAB_0013a73a;
  case 6:
    if (src == 2) goto LAB_0013a272;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0013a27b;
      if (type == 3) goto LAB_0013a1ad;
      goto LAB_0013a758;
    }
    goto LAB_0013a707;
  case 7:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_0013a70f;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar5 = 2;
LAB_0013a220:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x3b].stopped.type,iVar5);
      return;
    }
    goto LAB_0013a721;
  case 8:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_0013a6f7;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar5 = 1;
      goto LAB_0013a220;
    }
    goto LAB_0013a717;
  default:
    nn_ws_handshake_handler_cold_44();
  case 9:
    nn_ws_handshake_handler_cold_1();
LAB_0013a6cd:
    nn_ws_handshake_handler_cold_33();
LAB_0013a6d5:
    nn_ws_handshake_handler_cold_34();
LAB_0013a6df:
    nn_ws_handshake_handler_cold_17();
LAB_0013a6e7:
    nn_ws_handshake_handler_cold_23();
LAB_0013a6ef:
    nn_ws_handshake_handler_cold_20();
LAB_0013a6f7:
    nn_ws_handshake_handler_cold_3();
LAB_0013a6ff:
    nn_ws_handshake_handler_cold_32();
LAB_0013a707:
    nn_ws_handshake_handler_cold_8();
LAB_0013a70f:
    nn_ws_handshake_handler_cold_5();
LAB_0013a717:
    nn_ws_handshake_handler_cold_2();
LAB_0013a721:
    nn_ws_handshake_handler_cold_4();
LAB_0013a72b:
    nn_ws_handshake_handler_cold_6();
LAB_0013a735:
    nn_ws_handshake_handler_cold_42();
LAB_0013a73a:
    nn_ws_handshake_handler_cold_16();
LAB_0013a744:
    nn_ws_handshake_handler_cold_19();
  }
  nn_ws_handshake_handler_cold_31();
LAB_0013a758:
  nn_ws_handshake_handler_cold_7();
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}